

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O0

void * randomx::AlignedAllocator<64UL>::allocMemory(size_t count)

{
  int iVar1;
  undefined8 uVar2;
  size_t in_RDI;
  void *mem;
  bad_alloc *this;
  bad_alloc *local_20;
  undefined8 local_18;
  bad_alloc *local_8;
  
  local_18 = 0x40;
  iVar1 = posix_memalign(&local_20,0x40,in_RDI);
  if (iVar1 == 0) {
    local_8 = local_20;
  }
  else {
    local_8 = (bad_alloc *)0x0;
  }
  if (local_8 != (bad_alloc *)0x0) {
    return local_8;
  }
  this = local_8;
  uVar2 = __cxa_allocate_exception(8);
  std::bad_alloc::bad_alloc(this);
  __cxa_throw(uVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void* AlignedAllocator<alignment>::allocMemory(size_t count) {
		void *mem = rx_aligned_alloc(count, alignment);
		if (mem == nullptr)
			throw std::bad_alloc();
		return mem;
	}